

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::AddMv::dim_forward
          (Dim *__return_storage_ptr__,AddMv *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pDVar1 == 0x48) && (pDVar1->nd < 3)) &&
      (pDVar1->d[0] == pDVar1[1].d[0])) && (pDVar1[1].nd == 1)) {
    __return_storage_ptr__->bd = pDVar1->bd;
    uVar2 = *(undefined8 *)(pDVar1->d + 2);
    uVar3 = *(undefined8 *)(pDVar1->d + 4);
    uVar4 = *(undefined8 *)(pDVar1->d + 6);
    *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar1->d;
    *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
    *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments in AddMv: ",0x18);
  poVar5 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar5);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to AddMv");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim AddMv::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      xs[0].ndims() > 2 ||
      xs[0].rows() != xs[1].rows() ||
      xs[1].ndims() != 1) {
    cerr << "Bad arguments in AddMv: " << xs << endl;
    throw std::invalid_argument("invalid arguments to AddMv");
  }
  return xs[0];
}